

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_sharded.hpp
# Opt level: O1

size_t __thiscall
ylt::util::
map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<22UL>_>::my_hash<131UL>_>
::erase(map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<22UL>_>::my_hash<131UL>_>
        *this,key_type *key)

{
  pointer pmVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  size_type sVar5;
  
  uVar3 = 0;
  if (key->_M_string_length != 0) {
    sVar5 = 0;
    do {
      uVar2 = (int)uVar3 * 0x83 + (int)(key->_M_dataplus)._M_p[sVar5];
      uVar3 = (ulong)uVar2;
      sVar5 = sVar5 + 1;
    } while (key->_M_string_length != sVar5);
    uVar3 = (ulong)uVar2;
  }
  pmVar1 = (this->shards_).
           super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = internal::
          map_lock_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>
          ::erase(pmVar1 + uVar3 % (ulong)((long)(this->shards_).
                                                 super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pmVar1 >> 4),key);
  if (sVar4 != 0) {
    LOCK();
    (this->size_).super___atomic_base<long>._M_i =
         (this->size_).super___atomic_base<long>._M_i - sVar4;
    UNLOCK();
  }
  return sVar4;
}

Assistant:

size_t erase(const key_type& key) {
    auto result = get_sharded(Hash{}(key)).erase(key);
    if (result) {
      size_.fetch_sub(result);
    }
    return result;
  }